

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

string * strip(string *__return_storage_ptr__,string *str,char c)

{
  pointer pcVar1;
  int iVar2;
  ulong uVar3;
  
  for (iVar2 = 0; uVar3 = (ulong)iVar2, uVar3 < str->_M_string_length; iVar2 = iVar2 + 1) {
    pcVar1 = (str->_M_dataplus)._M_p;
    if (pcVar1[uVar3] == c) {
      std::__cxx11::string::erase(str,pcVar1 + uVar3);
      iVar2 = iVar2 + -1;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

inline string strip(string& str, const char c) {
    for (int i = 0; i < str.length(); ++i) {
        char current = str[i];
        if(current == c) {
            str.erase(str.begin() + i);
            i--;
        }
    }

    return str;
}